

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synth_core.cpp
# Opt level: O1

void __thiscall V2Voice::set(V2Voice *this,syVV2 *para)

{
  int iVar1;
  long lVar2;
  V2Osc *this_00;
  V2Env *this_01;
  V2Flt *this_02;
  V2LFO *this_03;
  float fVar3;
  float fVar4;
  
  fVar3 = para->transp + -64.0;
  this->xpose = fVar3;
  iVar1 = this->note;
  this_00 = this->osc;
  lVar2 = 0;
  do {
    *(float *)((long)&this->osc[0].note + lVar2) = (float)iVar1 + fVar3;
    lVar2 = lVar2 + 0x40;
  } while (lVar2 != 0xc0);
  this->fmode = (int)para->routing;
  this->keysync = (int)para->oscsync;
  fVar4 = para->panning * 0.0078125;
  fVar3 = 1.0 - fVar4;
  if (fVar3 < 0.0) {
    fVar3 = sqrtf(fVar3);
  }
  else {
    fVar3 = SQRT(fVar3);
  }
  this->lvol = fVar3;
  if (fVar4 < 0.0) {
    fVar4 = sqrtf(fVar4);
  }
  else {
    fVar4 = SQRT(fVar4);
  }
  this->rvol = fVar4;
  fVar3 = (para->fltbal + -64.0) * 0.015625;
  if (0.0 <= fVar3) {
    this->f2gain = 1.0;
    this->f1gain = 1.0 - fVar3;
  }
  else {
    this->f1gain = 1.0;
    this->f2gain = fVar3 + 1.0;
  }
  lVar2 = 8;
  do {
    V2Osc::set(this_00,(syVOsc *)((long)para->osc + lVar2 + -8));
    lVar2 = lVar2 + 0x18;
    this_00 = this_00 + 1;
  } while (lVar2 != 0x50);
  this_01 = this->env;
  lVar2 = 0;
  do {
    V2Env::set(this_01,(syVEnv *)((long)&para->env[0].ar + lVar2));
    lVar2 = lVar2 + 0x18;
    this_01 = this_01 + 1;
  } while (lVar2 == 0x18);
  this_02 = this->vcf;
  lVar2 = 0;
  do {
    V2Flt::set(this_02,(syVFlt *)((long)&para->flt[0].mode + lVar2));
    lVar2 = lVar2 + 0xc;
    this_02 = this_02 + 1;
  } while (lVar2 == 0xc);
  this_03 = this->lfo;
  lVar2 = 0;
  do {
    V2LFO::set(this_03,(syVLFO *)((long)&para->lfo[0].mode + lVar2));
    lVar2 = lVar2 + 0x1c;
    this_03 = this_03 + 1;
  } while (lVar2 == 0x1c);
  V2Dist::set(&this->dist,&para->dist);
  return;
}

Assistant:

void set(const syVV2 *para)
    {
        xpose = para->transp - 64.0f;
        updateNote();

        fmode = (int)para->routing;
        keysync = (int)para->oscsync;

        // equal power panning
        float p = para->panning / 128.0f;
        lvol = sqrtf(1.0f - p);
        rvol = sqrtf(p);

        // filter balance for parallel
        float x = (para->fltbal - 64.0f) / 64.0f;
        if (x >= 0.0f)
        {
            f2gain = 1.0f;
            f1gain = 1.0f - x;
        }
        else
        {
            f1gain = 1.0f;
            f2gain = 1.0f + x;
        }

        // subsections
        for (int i=0; i < syVV2::NOSC; i++)
            osc[i].set(&para->osc[i]);

        for (int i=0; i < syVV2::NENV; i++)
            env[i].set(&para->env[i]);

        for (int i=0; i < syVV2::NFLT; i++)
            vcf[i].set(&para->flt[i]);

        for (int i=0; i < syVV2::NLFO; i++)
            lfo[i].set(&para->lfo[i]);

        dist.set(&para->dist);
    }